

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
          (double *begin,double *end)

{
  double *pdVar1;
  byte *pbVar2;
  byte *pbVar3;
  double dVar4;
  double dVar5;
  byte bVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  double *pdVar21;
  double __tmp;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
  pVar22;
  uchar offsets_l_storage [128];
  byte abStack_101 [128];
  byte abStack_81 [81];
  
  dVar4 = *begin;
  lVar8 = 0;
  do {
    dVar5 = *(double *)((long)begin + lVar8 + 8);
    lVar8 = lVar8 + 8;
  } while (dVar5 < dVar4);
  pdVar1 = (double *)((long)begin + lVar8);
  pdVar17 = end;
  if (lVar8 == 8) {
    do {
      if (end <= pdVar1) break;
      pdVar17 = end + -1;
      pdVar12 = end + -1;
      end = pdVar17;
    } while (dVar4 < *pdVar12 || dVar4 == *pdVar12);
  }
  else {
    do {
      end = pdVar17 + -1;
      pdVar12 = pdVar17 + -1;
      pdVar17 = end;
    } while (dVar4 < *pdVar12 || dVar4 == *pdVar12);
  }
  pdVar17 = pdVar1;
  if (pdVar1 < end) {
    pdVar16 = (double *)((long)begin + lVar8) + 1;
    *(double *)((long)begin + lVar8) = *end;
    *end = dVar5;
    pdVar17 = pdVar16;
    pdVar12 = end;
    pdVar20 = end;
    if (pdVar16 < end) {
      lVar8 = 0;
      uVar19 = 0;
      uVar13 = 0;
      lVar18 = 0;
      do {
        uVar9 = (long)pdVar12 - (long)pdVar17 >> 3;
        uVar10 = uVar9 >> (uVar19 == 0);
        if (uVar13 != 0) {
          uVar10 = 0;
        }
        uVar9 = uVar9 - uVar10;
        if (uVar19 != 0) {
          uVar9 = 0;
        }
        if (uVar10 < 0x40) {
          uVar14 = uVar13;
          if (uVar10 != 0) {
            lVar11 = 0;
            uVar14 = 0;
            do {
              abStack_81[uVar13 + 1] = (byte)uVar14;
              pdVar21 = pdVar17 + uVar14;
              uVar14 = uVar14 + 1;
              uVar13 = (dVar4 < *pdVar21 || dVar4 == *pdVar21) + uVar13;
              lVar11 = lVar11 + -8;
            } while (uVar10 != uVar14);
            pdVar17 = (double *)((long)pdVar17 - lVar11);
            uVar14 = uVar13;
          }
        }
        else {
          lVar11 = 0;
          uVar10 = 0xfffffffffffffff8;
          do {
            uVar14 = uVar10 + 8;
            abStack_81[uVar13 + 1] = (byte)uVar14;
            lVar15 = (dVar4 < pdVar17[uVar10 + 8] || dVar4 == pdVar17[uVar10 + 8]) + uVar13;
            cVar7 = (char)uVar10;
            abStack_81[lVar15 + 1] = cVar7 + 9;
            lVar15 = (ulong)(dVar4 < pdVar17[uVar10 + 9] || dVar4 == pdVar17[uVar10 + 9]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 10;
            lVar15 = (ulong)(dVar4 < pdVar17[uVar10 + 10] || dVar4 == pdVar17[uVar10 + 10]) + lVar15
            ;
            abStack_81[lVar15 + 1] = cVar7 + 0xb;
            lVar15 = (ulong)(dVar4 < pdVar17[uVar10 + 0xb] || dVar4 == pdVar17[uVar10 + 0xb]) +
                     lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xc;
            lVar15 = (ulong)(dVar4 < pdVar17[uVar10 + 0xc] || dVar4 == pdVar17[uVar10 + 0xc]) +
                     lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xd;
            lVar15 = (ulong)(dVar4 < pdVar17[uVar10 + 0xd] || dVar4 == pdVar17[uVar10 + 0xd]) +
                     lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xe;
            lVar15 = (ulong)(dVar4 < pdVar17[uVar10 + 0xe] || dVar4 == pdVar17[uVar10 + 0xe]) +
                     lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xf;
            uVar13 = (ulong)(dVar4 < pdVar17[uVar10 + 0xf] || dVar4 == pdVar17[uVar10 + 0xf]) +
                     lVar15;
            lVar11 = lVar11 + 0x40;
            uVar10 = uVar14;
          } while (uVar14 < 0x38);
          pdVar17 = (double *)((long)pdVar17 + lVar11);
          uVar14 = uVar13;
        }
        if (uVar9 < 0x40) {
          if (uVar9 != 0) {
            uVar13 = 0;
            do {
              uVar13 = uVar13 + 1;
              abStack_101[uVar19 + 1] = (byte)uVar13;
              pdVar21 = pdVar12 + -1;
              pdVar12 = pdVar12 + -1;
              uVar19 = uVar19 + (*pdVar21 <= dVar4 && dVar4 != *pdVar21);
            } while (uVar9 != uVar13);
          }
        }
        else {
          uVar13 = 0xfffffffffffffff8;
          do {
            cVar7 = (char)uVar13;
            abStack_101[uVar19 + 1] = cVar7 + 9;
            lVar11 = (pdVar12[-1] <= dVar4 && dVar4 != pdVar12[-1]) + uVar19;
            abStack_101[lVar11 + 1] = cVar7 + 10;
            lVar11 = (ulong)(pdVar12[-2] <= dVar4 && dVar4 != pdVar12[-2]) + lVar11;
            abStack_101[lVar11 + 1] = cVar7 + 0xb;
            lVar11 = (ulong)(pdVar12[-3] <= dVar4 && dVar4 != pdVar12[-3]) + lVar11;
            abStack_101[lVar11 + 1] = cVar7 + 0xc;
            lVar11 = (ulong)(pdVar12[-4] <= dVar4 && dVar4 != pdVar12[-4]) + lVar11;
            abStack_101[lVar11 + 1] = cVar7 + 0xd;
            lVar11 = (ulong)(pdVar12[-5] <= dVar4 && dVar4 != pdVar12[-5]) + lVar11;
            abStack_101[lVar11 + 1] = cVar7 + 0xe;
            lVar11 = (ulong)(pdVar12[-6] <= dVar4 && dVar4 != pdVar12[-6]) + lVar11;
            abStack_101[lVar11 + 1] = cVar7 + 0xf;
            lVar11 = (ulong)(pdVar12[-7] <= dVar4 && dVar4 != pdVar12[-7]) + lVar11;
            abStack_101[lVar11 + 1] = cVar7 + 0x10;
            pdVar21 = pdVar12 + -8;
            pdVar12 = pdVar12 + -8;
            uVar19 = (ulong)(*pdVar21 <= dVar4 && dVar4 != *pdVar21) + lVar11;
            uVar13 = uVar13 + 8;
          } while (uVar13 < 0x38);
        }
        uVar10 = uVar14;
        if (uVar19 < uVar14) {
          uVar10 = uVar19;
        }
        pbVar2 = abStack_81 + lVar18 + 1;
        pbVar3 = abStack_101 + lVar8 + 1;
        if (uVar14 == uVar19) {
          if (uVar10 != 0) {
            uVar13 = 0;
            do {
              bVar6 = pbVar3[uVar13];
              dVar5 = pdVar16[pbVar2[uVar13]];
              pdVar16[pbVar2[uVar13]] = pdVar20[-(ulong)bVar6];
              pdVar20[-(ulong)bVar6] = dVar5;
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
        }
        else if (uVar10 != 0) {
          pdVar21 = pdVar20 + -(ulong)*pbVar3;
          dVar5 = pdVar16[*pbVar2];
          pdVar16[*pbVar2] = *pdVar21;
          if (uVar10 != 1) {
            uVar13 = 1;
            do {
              bVar6 = pbVar2[uVar13];
              *pdVar21 = pdVar16[bVar6];
              pdVar21 = pdVar20 + -(ulong)pbVar3[uVar13];
              pdVar16[bVar6] = *pdVar21;
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
          *pdVar21 = dVar5;
        }
        uVar13 = uVar14 - uVar10;
        lVar18 = lVar18 + uVar10;
        lVar8 = lVar8 + uVar10;
        if (uVar14 <= uVar19) {
          lVar18 = 0;
          pdVar16 = pdVar17;
        }
        uVar19 = uVar19 - uVar10;
        if (uVar19 == 0) {
          lVar8 = 0;
          pdVar20 = pdVar12;
        }
      } while (pdVar17 < pdVar12);
    }
    else {
      uVar13 = 0;
      uVar19 = 0;
      lVar8 = 0;
      lVar18 = 0;
    }
    for (; uVar13 != 0; uVar13 = uVar13 - 1) {
      dVar5 = pdVar16[abStack_81[uVar13 + lVar18]];
      pdVar16[abStack_81[uVar13 + lVar18]] = pdVar12[-1];
      pdVar12[-1] = dVar5;
      pdVar17 = pdVar12 + -1;
      pdVar12 = pdVar12 + -1;
    }
    for (; uVar19 != 0; uVar19 = uVar19 - 1) {
      dVar5 = pdVar20[-(ulong)abStack_101[uVar19 + lVar8]];
      pdVar20[-(ulong)abStack_101[uVar19 + lVar8]] = *pdVar17;
      *pdVar17 = dVar5;
      pdVar17 = pdVar17 + 1;
    }
  }
  pVar22._9_7_ = (undefined7)((ulong)pdVar1 >> 8);
  pVar22.second = end <= pdVar1;
  *begin = pdVar17[-1];
  pdVar17[-1] = dVar4;
  pVar22.first._M_current = pdVar17 + -1;
  return pVar22;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }